

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::CheckOpHelper(LinearScan *this,Instr *instr)

{
  Iterator *this_00;
  IRKind IVar1;
  uint uVar2;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  uint32 uVar6;
  uint32 helperSpilledLiveranges;
  uint uVar7;
  BranchInstr *pBVar8;
  undefined4 *puVar9;
  Lifetime *lifetime;
  PragmaInstr *instr_00;
  LabelInstr *pLVar10;
  Type *pTVar11;
  NodeBase *pNVar12;
  byte bVar13;
  SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *pSVar14;
  undefined1 local_50 [8];
  OpHelperSpilledLifetime spilledLifetime;
  
  if ((this->currentOpHelperBlock != (OpHelperBlock *)0x0) &&
     (this->currentOpHelperBlock->opHelperEndInstr == instr)) {
    spilledLifetime._8_8_ = instr;
    if (instr->m_kind == InstrKindBranch) {
      pBVar8 = IR::Instr::AsBranchInstr(instr);
      bVar4 = IR::BranchInstr::IsUnconditional(pBVar8);
      if (!bVar4) goto LAB_0052f8c4;
      pBVar8 = IR::Instr::AsBranchInstr(instr);
      bVar4 = IR::BranchInstr::IsMultiBranch(pBVar8);
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x23f,"(!instr->AsBranchInstr()->IsMultiBranch())",
                           "Not supported for Multibranch");
        if (!bVar4) goto LAB_0052fbd7;
        *puVar9 = 0;
      }
      pBVar8 = IR::Instr::AsBranchInstr(instr);
      pLVar10 = pBVar8->m_branchTarget;
    }
    else {
LAB_0052f8c4:
      pLVar10 = (LabelInstr *)0x0;
    }
    helperSpilledLiveranges = 0;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_0052f8e2:
    this_01 = this->opHelperSpilledLiveranges;
    if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
        (this_01->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next != this_01) {
      lifetime = SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Pop(this_01);
      uVar5 = *(ushort *)&lifetime->field_0x9c;
      *(ushort *)&lifetime->field_0x9c = uVar5 & 0xffef;
      if ((uVar5 & 0x40) == 0) {
        AssignActiveReg(this,lifetime,lifetime->reg);
        if (pLVar10 == (LabelInstr *)0x0) {
          bVar13 = (byte)*(undefined2 *)&lifetime->field_0x9c;
LAB_0052f9c2:
          spilledLifetime.lifetime._2_1_ = 1;
        }
        else {
          uVar2 = lifetime->end;
          uVar6 = IR::Instr::GetNumber(&pLVar10->super_Instr);
          bVar13 = (byte)*(ushort *)&lifetime->field_0x9c;
          if (uVar6 <= uVar2) goto LAB_0052f9c2;
          if ((*(ushort *)&lifetime->field_0x9c & 0x20) == 0) {
            pBVar8 = IR::Instr::AsBranchInstr((Instr *)spilledLifetime._8_8_);
            bVar4 = IR::BranchInstr::IsLoopTail(pBVar8,this->func);
            if (bVar4) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                 ,0x265,"(!instr->AsBranchInstr()->IsLoopTail(this->func))",
                                 "!instr->AsBranchInstr()->IsLoopTail(this->func)");
              if (!bVar4) goto LAB_0052fbd7;
              *puVar9 = 0;
            }
            goto LAB_0052f8e2;
          }
          spilledLifetime.lifetime._2_1_ = 0;
        }
        spilledLifetime.lifetime._1_1_ = bVar13 >> 5 & 1;
        helperSpilledLiveranges = helperSpilledLiveranges + 1;
        spilledLifetime.lifetime._0_1_ = lifetime->reg;
        local_50 = (undefined1  [8])lifetime;
        SList<OpHelperSpilledLifetime,_Memory::ArenaAllocator,_RealCount>::Prepend
                  (&this->currentOpHelperBlock->spilledLifetime,(OpHelperSpilledLifetime *)local_50)
        ;
        uVar5 = *(ushort *)&lifetime->field_0x9c;
      }
      else {
        uVar5 = uVar5 & 0xffaf;
      }
      *(ushort *)&lifetime->field_0x9c = uVar5 & 0xffdf;
      goto LAB_0052f8e2;
    }
    uVar7 = OpHelperBlock::Length(this->currentOpHelperBlock);
    this->totalOpHelperFullVisitedLength = this->totalOpHelperFullVisitedLength + uVar7;
    instr_00 = IR::PragmaInstr::New(Nop,0,this->func);
    IR::Instr::InsertBefore(this->currentOpHelperBlock->opHelperEndInstr,&instr_00->super_Instr);
    IR::Instr::CopyNumber(&instr_00->super_Instr,this->currentOpHelperBlock->opHelperEndInstr);
    this->currentOpHelperBlock->opHelperEndInstr = &instr_00->super_Instr;
    (this->opHelperSpilledRegs).word = 0;
    this->currentOpHelperBlock = (OpHelperBlock *)0x0;
    LinearScanMD::EndOfHelperBlock(&this->linearScanMD,helperSpilledLiveranges);
    instr = (Instr *)spilledLifetime._8_8_;
  }
  pSVar14 = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
            (this->opHelperBlockIter).current;
  if ((pSVar14 != (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
     (pSVar14 != (this->opHelperBlockIter).list)) {
    this_00 = &this->opHelperBlockIter;
    IVar1 = (((LabelInstr *)instr)->super_Instr).m_kind;
    if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
      pLVar10 = IR::Instr::AsLabelInstr(instr);
      if ((pLVar10->field_0x78 & 2) != 0) {
        pTVar11 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            (this_00);
        if (pTVar11->opHelperLabel != (LabelInstr *)instr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x29a,
                             "(!instr->IsLabelInstr() || !instr->AsLabelInstr()->isOpHelper || this->opHelperBlockIter.Data().opHelperLabel == instr)"
                             ,
                             "Found a helper label that doesn\'t begin the next helper block in the list?"
                            );
          if (!bVar4) goto LAB_0052fbd7;
          *puVar9 = 0;
        }
      }
    }
    pTVar11 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(this_00);
    if (pTVar11->opHelperLabel == (LabelInstr *)instr) {
      pTVar11 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(this_00)
      ;
      this->currentOpHelperBlock = pTVar11;
      pNVar12 = (this->opHelperBlockIter).current;
      if (pNVar12 == (NodeBase *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
LAB_0052fbd7:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
        pNVar12 = (this->opHelperBlockIter).current;
      }
      pSVar14 = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)pNVar12->next !=
          (this->opHelperBlockIter).list) {
        pSVar14 = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)pNVar12->next;
      }
      (this->opHelperBlockIter).current = &pSVar14->super_SListNodeBase<Memory::ArenaAllocator>;
    }
  }
  return;
}

Assistant:

void
LinearScan::CheckOpHelper(IR::Instr *instr)
{
    if (this->IsInHelperBlock())
    {
        if (this->currentOpHelperBlock->opHelperEndInstr == instr)
        {
            // Get targetInstr if we can.
            // We can deterministically get it only for unconditional branches, as conditional branch may fall through.
            IR::Instr * targetInstr = nullptr;
            if (instr->IsBranchInstr() && instr->AsBranchInstr()->IsUnconditional())
            {
                AssertMsg(!instr->AsBranchInstr()->IsMultiBranch(), "Not supported for Multibranch");
                targetInstr = instr->AsBranchInstr()->GetTarget();
            }

            /*
             * Keep track of the number of registers we've had to
             * store and restore around a helper block for LinearScanMD (on ARM
             * and X64). We need this to be able to allocate space in the frame.
             * We can't emit a PUSH/POP sequence around the block like IA32 because
             * the stack pointer can't move outside the prolog.
             */
            uint32 helperSpilledLiverangeCount = 0;

            // Exiting a helper block.  We are going to insert
            // the restore here after linear scan.  So put all the restored
            // lifetime back to active
            while (!this->opHelperSpilledLiveranges->Empty())
            {
                Lifetime * lifetime = this->opHelperSpilledLiveranges->Pop();
                lifetime->isOpHelperSpilled = false;

                if (!lifetime->cantOpHelperSpill)
                {
                    // Put the life time back to active
                    this->AssignActiveReg(lifetime, lifetime->reg);
                    bool reload = true;
                    // Lifetime ends before the target after helper block, don't need to save and restore helper spilled lifetime.
                    if (targetInstr && lifetime->end < targetInstr->GetNumber())
                    {
                        // However, if lifetime is spilled as arg - we still need to spill it because the helper assumes the value
                        // to be available in the stack
                        if (lifetime->isOpHelperSpillAsArg)
                        {
                            // we should not attempt to restore it as it is dead on return from the helper.
                            reload = false;
                        }
                        else
                        {
                            Assert(!instr->AsBranchInstr()->IsLoopTail(this->func));
                            continue;
                        }
                    }

                    // Save all the lifetime that needs to be restored
                    OpHelperSpilledLifetime spilledLifetime;
                    spilledLifetime.lifetime = lifetime;
                    spilledLifetime.spillAsArg = lifetime->isOpHelperSpillAsArg;
                    spilledLifetime.reload = reload;
                    /*
                     * Can't unfortunately move this into the else block above because we don't know if this
                     * lifetime will actually get spilled until register allocation completes.
                     * Instead we allocate a slot to this StackSym in LinearScanMD iff
                     * !(lifetime.isSpilled && lifetime.noReloadsIfSpilled).
                     */
                    helperSpilledLiverangeCount++;

                    // save the reg in case it is spilled later.  We still need to save and restore
                    // for the non-loop case.
                    spilledLifetime.reg = lifetime->reg;
                    this->currentOpHelperBlock->spilledLifetime.Prepend(spilledLifetime);
                }
                else
                {
                    // Clear it for the next helper block
                    lifetime->cantOpHelperSpill = false;
                }
                lifetime->isOpHelperSpillAsArg = false;
            }

            this->totalOpHelperFullVisitedLength += this->currentOpHelperBlock->Length();

            // Use a dummy label as the insertion point of the reloads, as second-chance-allocation
            // may insert compensation code right before the branch
            IR::PragmaInstr *dummyLabel = IR::PragmaInstr::New(Js::OpCode::Nop, 0, this->func);
            this->currentOpHelperBlock->opHelperEndInstr->InsertBefore(dummyLabel);
            dummyLabel->CopyNumber(this->currentOpHelperBlock->opHelperEndInstr);
            this->currentOpHelperBlock->opHelperEndInstr = dummyLabel;

            this->opHelperSpilledRegs.ClearAll();
            this->currentOpHelperBlock = nullptr;

            linearScanMD.EndOfHelperBlock(helperSpilledLiverangeCount);
        }
    }

    if (this->opHelperBlockIter.IsValid())
    {
        AssertMsg(
            !instr->IsLabelInstr() ||
            !instr->AsLabelInstr()->isOpHelper ||
            this->opHelperBlockIter.Data().opHelperLabel == instr,
            "Found a helper label that doesn't begin the next helper block in the list?");

        if (this->opHelperBlockIter.Data().opHelperLabel == instr)
        {
            this->currentOpHelperBlock = &this->opHelperBlockIter.Data();
            this->opHelperBlockIter.Next();
        }
    }
}